

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::make_bearer_token_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *token,bool is_proxy)

{
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  size_type local_30;
  char local_28 [16];
  
  std::operator+(&local_60,"Bearer ",token);
  local_40 = (undefined1  [8])0x199eb0;
  if ((int)CONCAT71(in_register_00000011,is_proxy) != 0) {
    local_40 = (undefined1  [8])0x199eaa;
  }
  local_38._M_p = local_28;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == &local_60.field_2) {
    local_28[8] = local_60.field_2._M_local_buf[8];
    local_28[9] = local_60.field_2._M_local_buf[9];
    local_28[10] = local_60.field_2._M_local_buf[10];
    local_28[0xb] = local_60.field_2._M_local_buf[0xb];
    local_28[0xc] = local_60.field_2._M_local_buf[0xc];
    local_28[0xd] = local_60.field_2._M_local_buf[0xd];
    local_28[0xe] = local_60.field_2._M_local_buf[0xe];
    local_28[0xf] = local_60.field_2._M_local_buf[0xf];
  }
  else {
    local_38._M_p = local_60._M_dataplus._M_p;
  }
  local_30 = local_60._M_string_length;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string>
make_bearer_token_authentication_header(const std::string &token,
                                        bool is_proxy = false) {
  auto field = "Bearer " + token;
  auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
  return std::make_pair(key, std::move(field));
}